

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

collision_shape_ptr __thiscall
APhyBullet::BulletEngine::createConvexHullShape
          (BulletEngine *this,aphy_scalar *coordinates,aphy_size num_points,aphy_size stride)

{
  Counter *this_00;
  int in_stack_00000020;
  int in_stack_00000024;
  btScalar *in_stack_00000028;
  btConvexHullShape *args;
  
  btConvexHullShape::operator_new(0x127f30);
  btConvexHullShape::btConvexHullShape
            ((btConvexHullShape *)CONCAT44(num_points,stride),in_stack_00000028,in_stack_00000024,
             in_stack_00000020);
  args = (btConvexHullShape *)&stack0xffffffffffffffe0;
  aphy::makeObject<APhyBullet::BulletCollisionShape,btConvexHullShape*>(args);
  this_00 = aphy::ref<aphy::collision_shape>::disown((ref<aphy::collision_shape> *)args);
  aphy::ref<aphy::collision_shape>::~ref((ref<aphy::collision_shape> *)this_00);
  return this_00;
}

Assistant:

collision_shape_ptr BulletEngine::createConvexHullShape(aphy_scalar* coordinates, aphy_size num_points, aphy_size stride)
{
    return makeObject<BulletCollisionShape> (
        new btConvexHullShape(coordinates, num_points, stride)
    ).disown();
}